

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msat.hpp
# Opt level: O2

SAT * __thiscall CompoundFile::MSAT::buildSAT(SAT *__return_storage_ptr__,MSAT *this)

{
  pointer pSVar1;
  pointer pSVar2;
  vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> sat;
  _Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar1 = (this->m_msat).
           super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pSVar2 = (this->m_msat).
                super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                _M_impl.super__Vector_impl_data._M_start; pSVar2 != pSVar1; pSVar2 = pSVar2 + 1) {
    std::istream::seekg(this->m_stream,
                        (long)pSVar2->m_id * (long)this->m_header->m_sectorSize + 0x200,0);
    loadSATSector(this->m_stream,
                  (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)&local_48,
                  this->m_header->m_sectorSize);
  }
  std::vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::vector
            (&__return_storage_ptr__->m_sat,
             (vector<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_> *)&local_48);
  std::_Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>::~_Vector_base
            (&local_48);
  return __return_storage_ptr__;
}

Assistant:

inline SAT
MSAT::buildSAT()
{
	std::vector< SecID > sat;

	for( std::vector< SecID >::const_iterator it = m_msat.begin(),
		last = m_msat.end(); it != last; ++it )
	{
		m_stream.seekg( calcFileOffset( *it, m_header.sectorSize() ) );

		loadSATSector( m_stream, sat, m_header.sectorSize() );
	}

	return SAT( sat );
}